

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

void __thiscall QCache<QString,_QConfFile>::Node::Node(Node *this,Node *other)

{
  Chain *pCVar1;
  
  pCVar1 = (other->super_Chain).next;
  (this->super_Chain).prev = (other->super_Chain).prev;
  (this->super_Chain).next = pCVar1;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->key).d,&(other->key).d);
  (this->value).t = (other->value).t;
  (this->value).cost = (other->value).cost;
  (other->value).t = (QConfFile *)0x0;
  ((this->super_Chain).prev)->next = &this->super_Chain;
  ((this->super_Chain).next)->prev = &this->super_Chain;
  return;
}

Assistant:

Node(Node &&other)
            : Chain(other),
              key(std::move(other.key)),
              value(std::move(other.value))
        {
            Q_ASSERT(this->prev);
            Q_ASSERT(this->next);
            this->prev->next = this;
            this->next->prev = this;
        }